

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::write_codepoint<8ul,char,fmt::v9::appender>
                   (appender out,char prefix,uint32_t cp)

{
  char local_22 [2];
  char buf [8];
  
  local_22[1] = 0x5c;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,local_22 + 1);
  local_22[0] = prefix;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,local_22);
  builtin_strncpy(buf,"00000000",8);
  format_uint<4u,char,unsigned_int>(buf,cp,8,false);
  buffer<char>::append<char>
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,buf,
             &stack0xffffffffffffffe8);
  return (appender)
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}